

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O3

void ZSTD_updateTree(ZSTD_matchState_t *ms,BYTE *ip,BYTE *iend)

{
  U32 mls;
  BYTE *pBVar1;
  U32 UVar2;
  uint target;
  U32 UVar3;
  bool bVar4;
  
  mls = (ms->cParams).minMatch;
  pBVar1 = (ms->window).base;
  UVar3 = ms->nextToUpdate;
  while (target = (uint)((long)ip - (long)pBVar1), UVar3 < target) {
    UVar2 = ZSTD_insertBt1(ms,pBVar1 + UVar3,iend,target,mls,0);
    bVar4 = UVar2 + UVar3 <= UVar3;
    UVar3 = UVar2 + UVar3;
    if (bVar4) {
      __assert_fail("idx < (U32)(idx + forward)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                    ,0x236,
                    "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                   );
    }
  }
  if ((ulong)((long)ip - (long)pBVar1) >> 0x20 != 0) {
    __assert_fail("(size_t)(ip - base) <= (size_t)(U32)(-1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                  ,0x239,
                  "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                 );
  }
  if ((ulong)((long)iend - (long)pBVar1) >> 0x20 == 0) {
    ms->nextToUpdate = target;
    return;
  }
  __assert_fail("(size_t)(iend - base) <= (size_t)(U32)(-1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                ,0x23a,
                "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
               );
}

Assistant:

void ZSTD_updateTree(ZSTD_matchState_t* ms, const BYTE* ip, const BYTE* iend) {
    ZSTD_updateTree_internal(ms, ip, iend, ms->cParams.minMatch, ZSTD_noDict);
}